

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::BaseRenderingTestInstance
          (BaseRenderingTestInstance *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderSize)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::Handle<(vk::HandleType)9>_> data_04;
  RefData<vk::Handle<(vk::HandleType)13>_> data_05;
  RefData<vk::Handle<(vk::HandleType)9>_> data_06;
  RefData<vk::Handle<(vk::HandleType)13>_> data_07;
  RefData<vk::Handle<(vk::HandleType)17>_> data_08;
  RefData<vk::Handle<(vk::HandleType)23>_> data_09;
  RefData<vk::Handle<(vk::HandleType)8>_> data_10;
  RefData<vk::Handle<(vk::HandleType)21>_> data_11;
  RefData<vk::Handle<(vk::HandleType)19>_> data_12;
  RefData<vk::Handle<(vk::HandleType)22>_> data_13;
  RefData<vk::Handle<(vk::HandleType)16>_> data_14;
  RefData<vk::Handle<(vk::HandleType)14>_> data_15;
  RefData<vk::Handle<(vk::HandleType)14>_> data_16;
  RefData<vk::Handle<(vk::HandleType)6>_> data_17;
  RefData<vk::Handle<(vk::HandleType)8>_> data_18;
  VkDevice pVVar2;
  VkDevice pVVar3;
  int iVar4;
  int iVar5;
  VkResult VVar6;
  VkPhysicalDeviceProperties *pVVar7;
  TextureFormat TVar8;
  MovePtr *this_00;
  InstanceInterface *pIVar9;
  VkPhysicalDevice pVVar10;
  NotSupportedError *pNVar11;
  Handle<(vk::HandleType)9> *pHVar12;
  Allocation *pAVar13;
  VkDeviceSize VVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  Handle<(vk::HandleType)17> *pHVar16;
  Handle<(vk::HandleType)8> *pHVar17;
  Handle<(vk::HandleType)21> *pHVar18;
  Handle<(vk::HandleType)22> *pHVar19;
  ProgramCollection<vk::ProgramBinary> *pPVar20;
  ProgramBinary *pPVar21;
  TestContext *pTVar22;
  TestLog *pTVar23;
  MessageBuilder *pMVar24;
  MovePtr *pMVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  VkAttachmentReference *local_f90;
  MessageBuilder local_d80;
  Bitfield<32UL> local_c00;
  MessageBuilder local_be8;
  deUint64 local_a68;
  deUint64 local_a60;
  uint local_a54;
  deUint64 local_a50;
  VkMemoryRequirements local_a48;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a30;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_a20;
  Move<vk::Handle<(vk::HandleType)8>_> local_a10;
  RefData<vk::Handle<(vk::HandleType)8>_> local_9f0;
  undefined1 local_9d0 [8];
  VkBufferCreateInfo bufferCreateInfo_1;
  RefData<vk::Handle<(vk::HandleType)6>_> local_978;
  allocator<char> local_951;
  string local_950;
  Move<vk::Handle<(vk::HandleType)14>_> local_930;
  RefData<vk::Handle<(vk::HandleType)14>_> local_910;
  allocator<char> local_8e9;
  string local_8e8;
  Move<vk::Handle<(vk::HandleType)14>_> local_8c8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_8a8;
  Move<vk::Handle<(vk::HandleType)16>_> local_888;
  RefData<vk::Handle<(vk::HandleType)16>_> local_868;
  undefined1 local_848 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  VkWriteDescriptorSet writeDescritporSet;
  VkDescriptorBufferInfo descriptorBufferInfo;
  RefData<vk::Handle<(vk::HandleType)22>_> local_7a0;
  undefined1 local_780 [8];
  VkDescriptorSetAllocateInfo descriptorSetParams;
  RefData<vk::Handle<(vk::HandleType)19>_> local_738;
  Move<vk::Handle<(vk::HandleType)21>_> local_718;
  RefData<vk::Handle<(vk::HandleType)21>_> local_6f8;
  deUint64 local_6d8;
  deUint64 local_6d0;
  uint local_6c4;
  deUint64 local_6c0;
  VkMemoryRequirements local_6b8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_6a0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_690;
  Move<vk::Handle<(vk::HandleType)8>_> local_680;
  RefData<vk::Handle<(vk::HandleType)8>_> local_660;
  undefined1 local_640 [8];
  VkBufferCreateInfo bufferCreateInfo;
  RefData<vk::Handle<(vk::HandleType)23>_> local_5e8;
  undefined1 local_5c8 [8];
  VkFramebufferCreateInfo framebufferCreateInfo;
  VkImageView attachments [2];
  Move<vk::Handle<(vk::HandleType)17>_> local_570;
  RefData<vk::Handle<(vk::HandleType)17>_> local_550;
  undefined1 local_530 [8];
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkSubpassDescription subpassDesc;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  VkAttachmentDescription attachmentDesc [2];
  undefined1 local_440 [4];
  VkImageLayout imageLayout;
  RefData<vk::Handle<(vk::HandleType)13>_> local_420;
  undefined1 local_400 [8];
  VkImageViewCreateInfo imageViewCreateInfo_1;
  VkMemoryRequirements local_390;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_378;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_368;
  Move<vk::Handle<(vk::HandleType)9>_> local_358;
  RefData<vk::Handle<(vk::HandleType)9>_> local_338;
  undefined1 local_318 [8];
  VkImageCreateInfo imageCreateInfo_1;
  VkImageFormatProperties properties_1;
  undefined1 local_298 [4];
  VkImageUsageFlags imageUsage_1;
  RefData<vk::Handle<(vk::HandleType)13>_> local_278;
  undefined1 local_258 [8];
  VkImageViewCreateInfo imageViewCreateInfo;
  VkMemoryRequirements local_1e8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1d0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1c0;
  Move<vk::Handle<(vk::HandleType)9>_> local_1b0;
  RefData<vk::Handle<(vk::HandleType)9>_> local_190;
  undefined1 local_170 [8];
  VkImageCreateInfo imageCreateInfo;
  VkImageFormatProperties properties;
  undefined1 local_f0 [4];
  VkImageUsageFlags imageUsage;
  RefData<vk::Handle<(vk::HandleType)24>_> local_d0;
  undefined1 local_b0 [8];
  DescriptorSetLayoutBuilder descriptorSetLayoutBuilder;
  DescriptorPoolBuilder descriptorPoolBuilder;
  Allocator *allocator;
  VkDevice pVStack_40;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vkd;
  deUint32 local_20;
  VkSampleCountFlagBits local_1c;
  deUint32 renderSize_local;
  VkSampleCountFlagBits sampleCount_local;
  Context *context_local;
  BaseRenderingTestInstance *this_local;
  
  local_20 = renderSize;
  local_1c = sampleCount;
  _renderSize_local = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_0166ed68;
  this->m_renderSize = local_20;
  this->m_sampleCount = local_1c;
  pVVar7 = Context::getDeviceProperties(_renderSize_local);
  this->m_subpixelBits = (pVVar7->limits).subPixelPrecisionBits;
  this->m_multisampling = (uint)(this->m_sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar8 = ::vk::mapVkFormat(this->m_imageFormat);
  this->m_textureFormat = TVar8;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_commandPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_image);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_imageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_resolvedImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_resolvedImageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_resolvedImageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_frameBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_uniformBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_uniformBufferMemory);
  this->m_uniformBufferSize = 4;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(&this->m_fence);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_resultBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_resultBufferMemory);
  iVar4 = local_20 * local_20;
  iVar5 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(uint)(iVar4 * iVar5);
  vkDevice = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVStack_40 = Context::getDevice((this->super_TestInstance).m_context);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  this_00 = (MovePtr *)Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSetLayoutBuilder.m_immutableSamplers.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_b0);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_f0,(DeviceInterface *)vkDevice,
             pVStack_40,2,allocator._4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d0,(Move *)local_f0);
  data_03.deleter.m_deviceIface = local_d0.deleter.m_deviceIface;
  data_03.object.m_internal = local_d0.object.m_internal;
  data_03.deleter.m_device = local_d0.deleter.m_device;
  data_03.deleter.m_allocator = local_d0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_commandPool,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_f0);
  pIVar9 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar10 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar4 = (*pIVar9->_vptr_InstanceInterface[4])
                    (pIVar9,pVVar10,(ulong)this->m_imageFormat,1,0,0x11,0,
                     &imageCreateInfo.initialLayout);
  if (iVar4 == -0xb) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xeb);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if ((properties.maxMipLevels & this->m_sampleCount) != this->m_sampleCount) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xf0);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_170._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateInfo._4_4_ = 0;
  imageCreateInfo.pNext._0_4_ = 0;
  imageCreateInfo.pNext._4_4_ = 1;
  imageCreateInfo.flags = this->m_imageFormat;
  imageCreateInfo.imageType = this->m_renderSize;
  imageCreateInfo.format = this->m_renderSize;
  imageCreateInfo.extent.width = 1;
  imageCreateInfo.extent.height = 1;
  imageCreateInfo.extent.depth = 1;
  imageCreateInfo.mipLevels = this->m_sampleCount;
  imageCreateInfo.arrayLayers = 0;
  imageCreateInfo.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageCreateInfo.usage = 1;
  imageCreateInfo._64_8_ = (long)&allocator + 4;
  imageCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(&local_1b0,(DeviceInterface *)vkDevice,pVStack_40,(VkImageCreateInfo *)local_170
                    ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_190,(Move *)&local_1b0);
  uVar26 = (undefined4)local_190.object.m_internal;
  uVar27 = (undefined4)(local_190.object.m_internal >> 0x20);
  data_04.deleter.m_deviceIface = local_190.deleter.m_deviceIface;
  data_04.object.m_internal = local_190.object.m_internal;
  data_04.deleter.m_device = local_190.deleter.m_device;
  data_04.deleter.m_allocator = local_190.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_image,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_1b0);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::getImageMemoryRequirements
            (&local_1e8,(DeviceInterface *)pVVar3,pVVar2,(VkImage)pHVar12->m_internal);
  pMVar25 = this_00;
  (*(*(_func_int ***)this_00)[3])(&local_1d0,this_00,&local_1e8,(ulong)::vk::MemoryRequirement::Any)
  ;
  local_1c0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1d0,pMVar25);
  data.ptr._4_4_ = uVar27;
  data.ptr._0_4_ = uVar26;
  data._8_8_ = local_190.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_imageMemory,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1d0);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar1 = pHVar12->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_imageMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  imageViewCreateInfo._72_8_ = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_imageMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x68))
                    (pVVar3,pVVar2,dVar1,imageViewCreateInfo._72_8_,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x109);
  local_258._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewCreateInfo._4_4_ = 0;
  imageViewCreateInfo.pNext._0_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  imageViewCreateInfo._16_8_ = pHVar12->m_internal;
  imageViewCreateInfo.image.m_internal._0_4_ = 1;
  imageViewCreateInfo.image.m_internal._4_4_ = this->m_imageFormat;
  imageViewCreateInfo._32_16_ = ::vk::makeComponentMappingRGBA();
  imageViewCreateInfo.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  imageViewCreateInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  imageViewCreateInfo.subresourceRange.aspectMask = 1;
  imageViewCreateInfo.subresourceRange.baseMipLevel = 0;
  imageViewCreateInfo.subresourceRange.levelCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_298,(DeviceInterface *)vkDevice,
             pVStack_40,(VkImageViewCreateInfo *)local_258,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_278,(Move *)local_298);
  data_05.deleter.m_deviceIface = local_278.deleter.m_deviceIface;
  data_05.object.m_internal = local_278.object.m_internal;
  data_05.deleter.m_device = local_278.deleter.m_device;
  data_05.deleter.m_allocator = local_278.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageView,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_298);
  if (this->m_multisampling != 0) {
    pIVar9 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar10 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    iVar4 = (*pIVar9->_vptr_InstanceInterface[4])
                      (pIVar9,pVVar10,(ulong)this->m_imageFormat,1,0,0x13,0,
                       &imageCreateInfo_1.initialLayout);
    if (iVar4 == -0xb) {
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar11,"Format not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x132);
      __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_318._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    imageCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageCreateInfo_1._4_4_ = 0;
    imageCreateInfo_1.pNext._0_4_ = 0;
    imageCreateInfo_1.pNext._4_4_ = 1;
    imageCreateInfo_1.flags = this->m_imageFormat;
    imageCreateInfo_1.imageType = this->m_renderSize;
    imageCreateInfo_1.format = this->m_renderSize;
    imageCreateInfo_1.extent.width = 1;
    imageCreateInfo_1.extent.height = 1;
    imageCreateInfo_1.extent.depth = 1;
    imageCreateInfo_1.mipLevels = 1;
    imageCreateInfo_1.arrayLayers = 0;
    imageCreateInfo_1.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
    imageCreateInfo_1.tiling = VK_IMAGE_TILING_OPTIMAL;
    imageCreateInfo_1.usage = 1;
    imageCreateInfo_1._64_8_ = (long)&allocator + 4;
    imageCreateInfo_1.pQueueFamilyIndices._0_4_ = 0;
    ::vk::createImage(&local_358,(DeviceInterface *)vkDevice,pVStack_40,
                      (VkImageCreateInfo *)local_318,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_338,(Move *)&local_358);
    uVar26 = (undefined4)local_338.object.m_internal;
    uVar27 = (undefined4)(local_338.object.m_internal >> 0x20);
    data_06.deleter.m_deviceIface = local_338.deleter.m_deviceIface;
    data_06.object.m_internal = local_338.object.m_internal;
    data_06.deleter.m_device = local_338.deleter.m_device;
    data_06.deleter.m_allocator = local_338.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
              (&this->m_resolvedImage,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_358);
    pVVar3 = vkDevice;
    pVVar2 = pVStack_40;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    ::vk::getImageMemoryRequirements
              (&local_390,(DeviceInterface *)pVVar3,pVVar2,(VkImage)pHVar12->m_internal);
    pMVar25 = this_00;
    (*(*(_func_int ***)this_00)[3])
              (&local_378,this_00,&local_390,(ulong)::vk::MemoryRequirement::Any);
    local_368 = de::details::MovePtr::operator_cast_to_PtrData(&local_378,pMVar25);
    data_00.ptr._4_4_ = uVar27;
    data_00.ptr._0_4_ = uVar26;
    data_00._8_8_ = local_338.deleter.m_deviceIface;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              (&this->m_resolvedImageMemory,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_378);
    pVVar3 = vkDevice;
    pVVar2 = pVStack_40;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar1 = pHVar12->m_internal;
    pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_resolvedImageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    imageViewCreateInfo_1._72_8_ = ::vk::Allocation::getMemory(pAVar13);
    pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_resolvedImageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    VVar14 = ::vk::Allocation::getOffset(pAVar13);
    VVar6 = (**(code **)(*(long *)pVVar3 + 0x68))
                      (pVVar3,pVVar2,dVar1,imageViewCreateInfo_1._72_8_,VVar14);
    ::vk::checkResult(VVar6,
                      "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                      ,0x14a);
    local_400._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    imageViewCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageViewCreateInfo_1._4_4_ = 0;
    imageViewCreateInfo_1.pNext._0_4_ = 0;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    imageViewCreateInfo_1._16_8_ = pHVar12->m_internal;
    imageViewCreateInfo_1.image.m_internal._0_4_ = 1;
    imageViewCreateInfo_1.image.m_internal._4_4_ = this->m_imageFormat;
    imageViewCreateInfo_1._32_16_ = ::vk::makeComponentMappingRGBA();
    imageViewCreateInfo_1.components.b = VK_COMPONENT_SWIZZLE_ZERO;
    imageViewCreateInfo_1.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
    imageViewCreateInfo_1.subresourceRange.aspectMask = 1;
    imageViewCreateInfo_1.subresourceRange.baseMipLevel = 0;
    imageViewCreateInfo_1.subresourceRange.levelCount = 1;
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_440,(DeviceInterface *)vkDevice,
               pVStack_40,(VkImageViewCreateInfo *)local_400,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_420,(Move *)local_440);
    data_07.deleter.m_deviceIface = local_420.deleter.m_deviceIface;
    data_07.object.m_internal = local_420.object.m_internal;
    data_07.deleter.m_device = local_420.deleter.m_device;
    data_07.deleter.m_allocator = local_420.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
              (&this->m_resolvedImageView,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_440);
  }
  attachmentRef.attachment = 0;
  attachmentRef.layout = this->m_imageFormat;
  resolveAttachmentRef.attachment = 0;
  resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDesc.pPreserveAttachments = (deUint32 *)0x200000001;
  renderPassCreateInfo.pDependencies._0_4_ = 0;
  renderPassCreateInfo.pDependencies._4_4_ = 0;
  subpassDesc.flags = 0;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments._0_4_ = 1;
  subpassDesc._24_8_ = &resolveAttachmentRef;
  if (this->m_multisampling == 0) {
    local_f90 = (VkAttachmentReference *)0x0;
  }
  else {
    local_f90 = (VkAttachmentReference *)&subpassDesc.pPreserveAttachments;
  }
  subpassDesc.pColorAttachments = local_f90;
  subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.pDepthStencilAttachment._0_4_ = 0;
  subpassDesc.preserveAttachmentCount = 0;
  subpassDesc._60_4_ = 0;
  local_530._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext._0_4_ = 0;
  renderPassCreateInfo.pNext._4_4_ = 2 - (uint)(this->m_multisampling == 0);
  renderPassCreateInfo._16_8_ = &attachmentRef;
  renderPassCreateInfo.pAttachments._0_4_ = 1;
  renderPassCreateInfo._32_8_ = &renderPassCreateInfo.pDependencies;
  renderPassCreateInfo.pSubpasses._0_4_ = 0;
  renderPassCreateInfo.dependencyCount = 0;
  renderPassCreateInfo._52_4_ = 0;
  ::vk::createRenderPass
            (&local_570,(DeviceInterface *)vkDevice,pVStack_40,(VkRenderPassCreateInfo *)local_530,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_550,(Move *)&local_570);
  data_08.deleter.m_deviceIface = local_550.deleter.m_deviceIface;
  data_08.object.m_internal = local_550.object.m_internal;
  data_08.deleter.m_device = local_550.deleter.m_device;
  data_08.deleter.m_allocator = local_550.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_570);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  framebufferCreateInfo._56_8_ = pHVar15->m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
            (&(this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  local_5c8._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.pNext._0_4_ = 0;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferCreateInfo._16_8_ = pHVar16->m_internal;
  framebufferCreateInfo.renderPass.m_internal._0_4_ = 2 - (uint)(this->m_multisampling == 0);
  framebufferCreateInfo._32_8_ = &framebufferCreateInfo.layers;
  framebufferCreateInfo.pAttachments._0_4_ = this->m_renderSize;
  framebufferCreateInfo.pAttachments._4_4_ = this->m_renderSize;
  framebufferCreateInfo.width = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo.pQueueFamilyIndices,
             (DeviceInterface *)vkDevice,pVStack_40,(VkFramebufferCreateInfo *)local_5c8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_5e8,(Move *)&bufferCreateInfo.pQueueFamilyIndices);
  data_09.deleter.m_deviceIface = local_5e8.deleter.m_deviceIface;
  data_09.object.m_internal = local_5e8.object.m_internal;
  data_09.deleter.m_device = local_5e8.deleter.m_device;
  data_09.deleter.m_allocator = local_5e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_frameBuffer,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  local_640._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext._0_4_ = 0;
  bufferCreateInfo._16_8_ = this->m_uniformBufferSize;
  bufferCreateInfo.size._0_4_ = 0x10;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_680,(DeviceInterface *)vkDevice,pVStack_40,
                     (VkBufferCreateInfo *)local_640,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_660,(Move *)&local_680);
  uVar26 = (undefined4)local_660.object.m_internal;
  uVar27 = (undefined4)(local_660.object.m_internal >> 0x20);
  data_10.deleter.m_deviceIface = local_660.deleter.m_deviceIface;
  data_10.object.m_internal = local_660.object.m_internal;
  data_10.deleter.m_device = local_660.deleter.m_device;
  data_10.deleter.m_allocator = local_660.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_uniformBuffer,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_680);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_6c0 = pHVar17->m_internal;
  ::vk::getBufferMemoryRequirements(&local_6b8,(DeviceInterface *)pVVar3,pVVar2,(VkBuffer)local_6c0)
  ;
  local_6c4 = ::vk::MemoryRequirement::HostVisible;
  pMVar25 = this_00;
  (*(*(_func_int ***)this_00)[3])
            (&local_6a0,this_00,&local_6b8,(ulong)::vk::MemoryRequirement::HostVisible);
  local_690 = de::details::MovePtr::operator_cast_to_PtrData(&local_6a0,pMVar25);
  data_01.ptr._4_4_ = uVar27;
  data_01.ptr._0_4_ = uVar26;
  data_01._8_8_ = local_660.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_uniformBufferMemory,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_6a0);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_6d0 = pHVar17->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_6d8 = (deUint64)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x60))(pVVar3,pVVar2,local_6d0,local_6d8,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x1d6);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)
             &descriptorSetLayoutBuilder.m_immutableSamplers.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1
            );
  ::vk::DescriptorPoolBuilder::build
            (&local_718,
             (DescriptorPoolBuilder *)
             &descriptorSetLayoutBuilder.m_immutableSamplers.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vkDevice,
             pVStack_40,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6f8,(Move *)&local_718);
  data_11.deleter.m_deviceIface = local_6f8.deleter.m_deviceIface;
  data_11.object.m_internal = local_6f8.object.m_internal;
  data_11.deleter.m_device = local_6f8.deleter.m_device;
  data_11.deleter.m_allocator = local_6f8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_718);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)local_b0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x7fffffff);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetParams.pSetLayouts,
             (DescriptorSetLayoutBuilder *)local_b0,(DeviceInterface *)vkDevice,pVStack_40,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_738,(Move *)&descriptorSetParams.pSetLayouts);
  data_12.deleter.m_deviceIface = local_738.deleter.m_deviceIface;
  data_12.object.m_internal = local_738.object.m_internal;
  data_12.deleter.m_device = local_738.deleter.m_device;
  data_12.deleter.m_allocator = local_738.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetParams.pSetLayouts);
  local_780._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetParams._4_4_ = 0;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorSetParams.pNext = (void *)pHVar18->m_internal;
  descriptorSetParams.descriptorPool.m_internal._0_4_ = 1;
  descriptorSetParams._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorBufferInfo.range,
             (DeviceInterface *)vkDevice,pVStack_40,(VkDescriptorSetAllocateInfo *)local_780);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_7a0,(Move *)&descriptorBufferInfo.range);
  data_13.deleter.m_deviceIface = local_7a0.deleter.m_deviceIface;
  data_13.object.m_internal = local_7a0.object.m_internal;
  data_13.deleter.m_device = local_7a0.deleter.m_device;
  data_13.deleter.m_pool.m_internal = local_7a0.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_13)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorBufferInfo.range);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  writeDescritporSet.pTexelBufferView = (VkBufferView *)pHVar17->m_internal;
  descriptorBufferInfo.buffer.m_internal = 0;
  descriptorBufferInfo.offset = 0xffffffffffffffff;
  pipelineLayoutCreateInfo.pPushConstantRanges._0_4_ = 0x23;
  writeDescritporSet.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  writeDescritporSet._4_4_ = 0;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  writeDescritporSet.pNext = (void *)pHVar19->m_internal;
  writeDescritporSet.dstSet.m_internal._0_4_ = 0;
  writeDescritporSet.dstSet.m_internal._4_4_ = 0;
  writeDescritporSet.dstBinding = 1;
  writeDescritporSet.dstArrayElement = 6;
  writeDescritporSet.descriptorCount = 0;
  writeDescritporSet.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  writeDescritporSet.pImageInfo = (VkDescriptorImageInfo *)&writeDescritporSet.pTexelBufferView;
  writeDescritporSet.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  (**(code **)(*(long *)vkDevice + 0x1f0))
            (vkDevice,pVStack_40,1,&pipelineLayoutCreateInfo.pPushConstantRanges,0,0);
  local_848._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutCreateInfo._4_4_ = 0;
  pipelineLayoutCreateInfo.pNext._0_4_ = 0;
  pipelineLayoutCreateInfo.pNext._4_4_ = 1;
  pipelineLayoutCreateInfo._16_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  pipelineLayoutCreateInfo.pSetLayouts._0_4_ = 0;
  pipelineLayoutCreateInfo.pushConstantRangeCount = 0;
  pipelineLayoutCreateInfo._36_4_ = 0;
  ::vk::createPipelineLayout
            (&local_888,(DeviceInterface *)vkDevice,pVStack_40,
             (VkPipelineLayoutCreateInfo *)local_848,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_868,(Move *)&local_888);
  data_14.deleter.m_deviceIface = local_868.deleter.m_deviceIface;
  data_14.object.m_internal = local_868.object.m_internal;
  data_14.deleter.m_device = local_868.deleter.m_device;
  data_14.deleter.m_allocator = local_868.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_888);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pPVar20 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"vertext_shader",&local_8e9);
  pPVar21 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar20,&local_8e8);
  ::vk::createShaderModule(&local_8c8,(DeviceInterface *)pVVar3,pVVar2,pPVar21,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_8a8,(Move *)&local_8c8);
  data_15.deleter.m_deviceIface = local_8a8.deleter.m_deviceIface;
  data_15.object.m_internal = local_8a8.object.m_internal;
  data_15.deleter.m_device = local_8a8.deleter.m_device;
  data_15.deleter.m_allocator = local_8a8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
            (&this->m_vertexShaderModule,data_15);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_8c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pPVar20 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"fragment_shader",&local_951);
  pPVar21 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar20,&local_950);
  ::vk::createShaderModule(&local_930,(DeviceInterface *)pVVar3,pVVar2,pPVar21,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_910,(Move *)&local_930);
  data_16.deleter.m_deviceIface = local_910.deleter.m_deviceIface;
  data_16.object.m_internal = local_910.object.m_internal;
  data_16.deleter.m_device = local_910.deleter.m_device;
  data_16.deleter.m_allocator = local_910.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
            (&this->m_fragmentShaderModule,data_16);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_930);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo_1.pQueueFamilyIndices,
                    (DeviceInterface *)vkDevice,pVStack_40,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_978,(Move *)&bufferCreateInfo_1.pQueueFamilyIndices);
  data_17.deleter.m_deviceIface = local_978.deleter.m_deviceIface;
  data_17.object.m_internal = local_978.object.m_internal;
  data_17.deleter.m_device = local_978.deleter.m_device;
  data_17.deleter.m_allocator = local_978.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=(&this->m_fence,data_17);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo_1.pQueueFamilyIndices);
  local_9d0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext._0_4_ = 0;
  bufferCreateInfo_1._16_8_ = this->m_resultBufferSize;
  bufferCreateInfo_1.size._0_4_ = 2;
  bufferCreateInfo_1.size._4_4_ = 0;
  bufferCreateInfo_1.usage = 1;
  bufferCreateInfo_1._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_a10,(DeviceInterface *)vkDevice,pVStack_40,
                     (VkBufferCreateInfo *)local_9d0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_9f0,(Move *)&local_a10);
  uVar26 = (undefined4)local_9f0.object.m_internal;
  uVar27 = (undefined4)(local_9f0.object.m_internal >> 0x20);
  data_18.deleter.m_deviceIface = local_9f0.deleter.m_deviceIface;
  data_18.object.m_internal = local_9f0.object.m_internal;
  data_18.deleter.m_device = local_9f0.deleter.m_device;
  data_18.deleter.m_allocator = local_9f0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_resultBuffer,data_18);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_a10);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_a50 = pHVar17->m_internal;
  ::vk::getBufferMemoryRequirements(&local_a48,(DeviceInterface *)pVVar3,pVVar2,(VkBuffer)local_a50)
  ;
  local_a54 = ::vk::MemoryRequirement::HostVisible;
  (*(*(_func_int ***)this_00)[3])
            (&local_a30,this_00,&local_a48,(ulong)::vk::MemoryRequirement::HostVisible);
  local_a20 = de::details::MovePtr::operator_cast_to_PtrData(&local_a30,this_00);
  data_02.ptr._4_4_ = uVar27;
  data_02.ptr._0_4_ = uVar26;
  data_02._8_8_ = local_9f0.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_resultBufferMemory,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a30);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_40;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_a60 = pHVar17->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_a68 = (deUint64)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x60))(pVVar3,pVVar2,local_a60,local_a68,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x22e);
  pTVar22 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar23 = tcu::TestContext::getLog(pTVar22);
  tcu::TestLog::operator<<(&local_be8,pTVar23,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar24 = tcu::MessageBuilder::operator<<(&local_be8,(char (*) [16])"Sample count = ");
  ::vk::getSampleCountFlagsStr(&local_c00,this->m_sampleCount);
  pMVar24 = tcu::MessageBuilder::operator<<(pMVar24,&local_c00);
  tcu::MessageBuilder::operator<<(pMVar24,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_be8);
  pTVar22 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar23 = tcu::TestContext::getLog(pTVar22);
  tcu::TestLog::operator<<(&local_d80,pTVar23,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar24 = tcu::MessageBuilder::operator<<(&local_d80,(char (*) [17])"SUBPIXEL_BITS = ");
  pMVar24 = tcu::MessageBuilder::operator<<(pMVar24,&this->m_subpixelBits);
  tcu::MessageBuilder::operator<<(pMVar24,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_d80);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_b0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSetLayoutBuilder.m_immutableSamplers.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BaseRenderingTestInstance::BaseRenderingTestInstance (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderSize)
	: TestInstance			(context)
	, m_renderSize			(renderSize)
	, m_sampleCount			(sampleCount)
	, m_subpixelBits		(context.getDeviceProperties().limits.subPixelPrecisionBits)
	, m_multisampling		(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat		(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize	(sizeof(float))
	, m_resultBufferSize	(renderSize * renderSize * m_textureFormat.getPixelSize())
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	DescriptorPoolBuilder						descriptorPoolBuilder;
	DescriptorSetLayoutBuilder					descriptorSetLayoutBuilder;

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}

	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderSize,								// deUint32					width;
			m_renderSize,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// Descriptors
	{
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		descriptorSetLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_ALL);
		m_descriptorSetLayout = descriptorSetLayoutBuilder.build(vkd, vkDevice);

		const VkDescriptorSetAllocateInfo		descriptorSetParams		=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*m_descriptorPool,
			1u,
			&m_descriptorSetLayout.get(),
		};

		m_descriptorSet = allocateDescriptorSet(vkd, vkDevice, &descriptorSetParams);

		const VkDescriptorBufferInfo			descriptorBufferInfo	=
		{
			*m_uniformBuffer,							// VkBuffer		buffer;
			0u,											// VkDeviceSize	offset;
			VK_WHOLE_SIZE								// VkDeviceSize	range;
		};

		const VkWriteDescriptorSet				writeDescritporSet		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,		// VkStructureType					sType;
			DE_NULL,									// const void*						pNext;
			*m_descriptorSet,							// VkDescriptorSet					destSet;
			0,											// deUint32							destBinding;
			0,											// deUint32							destArrayElement;
			1u,											// deUint32							count;
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,			// VkDescriptorType					descriptorType;
			DE_NULL,									// const VkDescriptorImageInfo*		pImageInfo;
			&descriptorBufferInfo,						// const VkDescriptorBufferInfo*	pBufferInfo;
			DE_NULL										// const VkBufferView*				pTexelBufferView;
		};

		vkd.updateDescriptorSets(vkDevice, 1u, &writeDescritporSet, 0u, DE_NULL);
	}

	// Pipeline Layout
	{
		const VkPipelineLayoutCreateInfo		pipelineLayoutCreateInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			0u,													// VkPipelineLayoutCreateFlags	flags;
			1u,													// deUint32						descriptorSetCount;
			&m_descriptorSetLayout.get(),						// const VkDescriptorSetLayout*	pSetLayouts;
			0u,													// deUint32						pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*	pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vkd, vkDevice, &pipelineLayoutCreateInfo);
	}

	// Shaders
	{
		m_vertexShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("vertext_shader"), 0);
		m_fragmentShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("fragment_shader"), 0);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Sample count = " << getSampleCountFlagsStr(m_sampleCount) << tcu::TestLog::EndMessage;
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}